

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,REF_DICT original)

{
  REF_DICT pRVar1;
  REF_INT *pRVar2;
  REF_INT local_44;
  REF_INT local_40;
  REF_INT local_3c;
  REF_INT local_38;
  REF_INT local_34;
  REF_INT local_30;
  REF_INT dict_value;
  REF_INT dict_key;
  REF_INT key_index;
  REF_DICT ref_dict;
  REF_DICT original_local;
  REF_DICT *ref_dict_ptr_local;
  
  pRVar1 = (REF_DICT)malloc(0x20);
  *ref_dict_ptr = pRVar1;
  if (*ref_dict_ptr == (REF_DICT)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x39,
           "ref_dict_deep_copy","malloc *ref_dict_ptr of REF_DICT_STRUCT NULL");
    ref_dict_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_dict_ptr;
    pRVar1->n = original->n;
    pRVar1->max = original->max;
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x40,
             "ref_dict_deep_copy","malloc ref_dict->key of REF_INT negative");
      ref_dict_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)pRVar1->max << 2);
      pRVar1->key = pRVar2;
      if (pRVar1->key == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x40
               ,"ref_dict_deep_copy","malloc ref_dict->key of REF_INT NULL");
        ref_dict_ptr_local._4_4_ = 2;
      }
      else if (pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x41
               ,"ref_dict_deep_copy","malloc ref_dict->value of REF_INT negative");
        ref_dict_ptr_local._4_4_ = 1;
      }
      else {
        pRVar2 = (REF_INT *)malloc((long)pRVar1->max << 2);
        pRVar1->value = pRVar2;
        if (pRVar1->value == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
                 0x41,"ref_dict_deep_copy","malloc ref_dict->value of REF_INT NULL");
          ref_dict_ptr_local._4_4_ = 2;
        }
        else {
          dict_value = 0;
          if (original->n < 1) {
            local_38 = -1;
          }
          else {
            local_38 = *original->key;
          }
          local_30 = local_38;
          if (original->n < 1) {
            local_3c = -1;
          }
          else {
            local_3c = *original->value;
          }
          local_34 = local_3c;
          while (dict_value < original->n) {
            pRVar1->key[dict_value] = local_30;
            pRVar1->value[dict_value] = local_34;
            dict_value = dict_value + 1;
            if ((dict_value < 0) || (original->n <= dict_value)) {
              local_40 = -1;
            }
            else {
              local_40 = original->key[dict_value];
            }
            local_30 = local_40;
            if ((dict_value < 0) || (original->n <= dict_value)) {
              local_44 = -1;
            }
            else {
              local_44 = original->value[dict_value];
            }
            local_34 = local_44;
          }
          ref_dict_ptr_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_dict_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,
                                      REF_DICT original) {
  REF_DICT ref_dict;
  REF_INT key_index, dict_key, dict_value;

  ref_malloc(*ref_dict_ptr, 1, REF_DICT_STRUCT);

  ref_dict = (*ref_dict_ptr);

  ref_dict_n(ref_dict) = ref_dict_n(original);
  ref_dict_max(ref_dict) = ref_dict_max(original);

  ref_malloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
  ref_malloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);

  each_ref_dict_key_value(original, key_index, dict_key, dict_value) {
    ref_dict_key(ref_dict, key_index) = dict_key;
    ref_dict_keyvalue(ref_dict, key_index) = dict_value;
  }

  return REF_SUCCESS;
}